

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_decompress4X_usingDTable_bmi2
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2
                 )

{
  byte *srcBuffer;
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 *puVar12;
  size_t sVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  undefined1 *puVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  undefined1 *puVar25;
  int iVar26;
  ulong uVar27;
  ulong *puVar28;
  ulong uVar29;
  undefined1 *puVar30;
  ulong uVar31;
  bool bVar32;
  ulong uStack_130;
  uint uStack_124;
  ulong uStack_120;
  ulong *puStack_118;
  uint uStack_10c;
  ulong *puStack_108;
  ulong *puStack_100;
  undefined1 *puStack_f8;
  size_t sStack_e0;
  BIT_DStream_t BStack_d8;
  undefined1 *puStack_a8;
  size_t sStack_a0;
  ulong *puStack_98;
  ulong *puStack_90;
  ulong *puStack_88;
  ulong uStack_78;
  ulong *puStack_70;
  ulong *puStack_68;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar13 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,bmi2);
    return sVar13;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar7 = *cSrc;
  uVar27 = (ulong)uVar7;
  uVar8 = *(ushort *)((long)cSrc + 2);
  uVar20 = (ulong)uVar8;
  uVar9 = *(ushort *)((long)cSrc + 4);
  uVar11 = (ulong)uVar9;
  uVar23 = uVar27 + uVar20 + uVar11 + 6;
  if (cSrcSize < uVar23) {
    return 0xffffffffffffffec;
  }
  puStack_68 = (ulong *)((long)cSrc + uVar27 + 6);
  if (uVar27 == 0) {
    uVar31 = 0xffffffffffffffb8;
    puStack_118 = (ulong *)0x0;
    puVar28 = (ulong *)0x0;
    puStack_88 = (ulong *)0x0;
    uVar17 = 0;
    uStack_120 = 0;
  }
  else {
    puVar28 = (ulong *)((long)cSrc + 6);
    puStack_88 = (ulong *)((long)cSrc + 0xe);
    if (7 < uVar7) {
      uStack_120 = *(ulong *)((long)cSrc + (uVar27 - 2));
      bVar14 = *(byte *)((long)cSrc + uVar27 + 5);
      uVar16 = 0x1f;
      if (bVar14 != 0) {
        for (; bVar14 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar16 = ~uVar16 + 9;
      if (bVar14 == 0) {
        uVar16 = 0;
      }
      uVar17 = (ulong)uVar16;
      uVar31 = uVar27 | -(ulong)(bVar14 == 0);
      puStack_118 = (ulong *)((long)cSrc + (uVar27 - 2));
      goto LAB_0023c0b6;
    }
    uStack_120 = (ulong)*(byte *)puVar28;
    switch(uVar7) {
    case 2:
      goto LAB_0023c070;
    case 3:
      goto LAB_0023c066;
    case 4:
      goto LAB_0023c05c;
    case 5:
      goto LAB_0023c051;
    case 6:
      break;
    case 7:
      uStack_120 = uStack_120 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
      break;
    default:
      goto switchD_0023c011_default;
    }
    uStack_120 = uStack_120 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
LAB_0023c051:
    uStack_120 = uStack_120 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
LAB_0023c05c:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
LAB_0023c066:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
LAB_0023c070:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
switchD_0023c011_default:
    bVar14 = *(byte *)((long)cSrc + uVar27 + 5);
    uVar16 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar16 == 0; uVar16 = uVar16 - 1) {
      }
    }
    if (bVar14 == 0) {
      uVar31 = 0xffffffffffffffec;
      uVar16 = 0;
    }
    else {
      uVar16 = ~uVar16 + 9 + ((uint)uVar7 * -8 + 0x40 & 0xffff);
      uVar31 = uVar27;
    }
    uVar17 = (ulong)uVar16;
    puStack_118 = puVar28;
  }
LAB_0023c0b6:
  if (0xffffffffffffff88 < uVar31) {
    return uVar31;
  }
  puStack_70 = (ulong *)((long)puStack_68 + uVar20);
  if (uVar20 == 0) {
    uVar20 = 0xffffffffffffffb8;
    uVar31 = 0;
    uStack_10c = 0;
    puStack_108 = (ulong *)0x0;
    puStack_68 = (ulong *)0x0;
    puStack_90 = (ulong *)0x0;
  }
  else {
    puStack_90 = (ulong *)((long)cSrc + uVar27 + 0xe);
    if (uVar8 < 8) {
      uVar31 = (ulong)(byte)*puStack_68;
      switch(uVar8) {
      case 7:
        uVar31 = uVar31 | (ulong)*(byte *)((long)cSrc + uVar27 + 0xc) << 0x30;
      case 6:
        uVar31 = uVar31 + ((ulong)*(byte *)((long)cSrc + uVar27 + 0xb) << 0x28);
      case 5:
        uVar31 = uVar31 + ((ulong)*(byte *)((long)cSrc + uVar27 + 10) << 0x20);
      case 4:
        uVar31 = uVar31 + (ulong)*(byte *)((long)cSrc + uVar27 + 9) * 0x1000000;
      case 3:
        uVar31 = uVar31 + (ulong)*(byte *)((long)cSrc + uVar27 + 8) * 0x10000;
      case 2:
        uVar31 = uVar31 + (ulong)*(byte *)((long)cSrc + uVar27 + 7) * 0x100;
      default:
        bVar14 = *(byte *)((long)puStack_70 + -1);
        uVar16 = 0x1f;
        if (bVar14 != 0) {
          for (; bVar14 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        puStack_108 = puStack_68;
        if (bVar14 == 0) {
          uVar20 = 0xffffffffffffffec;
          uStack_10c = 0;
        }
        else {
          uStack_10c = ~uVar16 + 9 + ((uint)uVar8 * -8 + 0x40 & 0xffff);
        }
      }
    }
    else {
      uVar31 = puStack_70[-1];
      bVar14 = *(byte *)((long)puStack_70 + -1);
      uVar16 = 0x1f;
      if (bVar14 != 0) {
        for (; bVar14 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uStack_10c = ~uVar16 + 9;
      if (bVar14 == 0) {
        uStack_10c = 0;
      }
      uVar20 = uVar20 | -(ulong)(bVar14 == 0);
      puStack_108 = puStack_70 + -1;
    }
  }
  if (0xffffffffffffff88 < uVar20) {
    return uVar20;
  }
  srcBuffer = (byte *)((long)puStack_70 + uVar11);
  if (uVar11 == 0) {
    uVar11 = 0xffffffffffffffb8;
    uStack_130 = 0;
    uStack_124 = 0;
    puStack_100 = (ulong *)0x0;
    puStack_70 = (ulong *)0x0;
    puStack_98 = (ulong *)0x0;
    goto LAB_0023c353;
  }
  puStack_98 = puStack_70 + 1;
  if (7 < uVar9) {
    uStack_130 = *(ulong *)(srcBuffer + -8);
    bVar14 = srcBuffer[-1];
    uVar16 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar16 == 0; uVar16 = uVar16 - 1) {
      }
    }
    uStack_124 = ~uVar16 + 9;
    if (bVar14 == 0) {
      uStack_124 = 0;
    }
    uVar11 = uVar11 | -(ulong)(bVar14 == 0);
    puStack_100 = (ulong *)(srcBuffer + -8);
    goto LAB_0023c353;
  }
  uStack_130 = (ulong)(byte)*puStack_70;
  switch(uVar9) {
  case 2:
    goto LAB_0023c2fb;
  case 3:
    goto LAB_0023c2f0;
  case 4:
    goto LAB_0023c2e5;
  case 5:
    goto LAB_0023c2d9;
  case 6:
    break;
  case 7:
    uStack_130 = uStack_130 | (ulong)*(byte *)((long)puStack_70 + 6) << 0x30;
    break;
  default:
    goto switchD_0023c297_default;
  }
  uStack_130 = uStack_130 + ((ulong)*(byte *)((long)puStack_70 + 5) << 0x28);
LAB_0023c2d9:
  uStack_130 = uStack_130 + ((ulong)*(byte *)((long)puStack_70 + 4) << 0x20);
LAB_0023c2e5:
  uStack_130 = uStack_130 + (ulong)*(byte *)((long)puStack_70 + 3) * 0x1000000;
LAB_0023c2f0:
  uStack_130 = uStack_130 + (ulong)*(byte *)((long)puStack_70 + 2) * 0x10000;
LAB_0023c2fb:
  uStack_130 = uStack_130 + (ulong)*(byte *)((long)puStack_70 + 1) * 0x100;
switchD_0023c297_default:
  bVar14 = srcBuffer[-1];
  uVar16 = 0x1f;
  if (bVar14 != 0) {
    for (; bVar14 >> uVar16 == 0; uVar16 = uVar16 - 1) {
    }
  }
  puStack_100 = puStack_70;
  if (bVar14 == 0) {
    uVar11 = 0xffffffffffffffec;
    uStack_124 = 0;
  }
  else {
    uStack_124 = ~uVar16 + 9 + ((uint)uVar9 * -8 + 0x40 & 0xffff);
  }
LAB_0023c353:
  if (0xffffffffffffff88 < uVar11) {
    return uVar11;
  }
  uStack_78 = (ulong)*(ushort *)((long)DTable + 2);
  puStack_a8 = (undefined1 *)dst;
  sStack_a0 = maxDstSize;
  sVar13 = BIT_initDStream(&BStack_d8,srcBuffer,cSrcSize - uVar23);
  if (0xffffffffffffff88 < sVar13) {
    return sVar13;
  }
  uVar11 = sStack_a0 + 3 >> 2;
  puVar1 = puStack_a8 + uVar11;
  puVar2 = puVar1 + uVar11;
  puVar12 = puStack_a8 + (sStack_a0 - 3);
  puVar3 = puVar2 + uVar11;
  sStack_e0 = BStack_d8.bitContainer;
  puVar21 = puVar2;
  puVar25 = puVar1;
  puVar30 = puStack_a8;
  puStack_f8 = puVar3;
  if (puVar3 < puVar12) {
    bVar14 = -(char)uStack_78 & 0x3f;
    lVar10 = uVar11 * 3;
    puVar25 = puStack_a8;
    do {
      puVar30 = puVar25;
      uVar20 = (uStack_120 << ((byte)uVar17 & 0x3f)) >> bVar14;
      uVar23 = (uVar31 << ((byte)uStack_10c & 0x3f)) >> bVar14;
      uVar27 = (uStack_130 << ((byte)uStack_124 & 0x3f)) >> bVar14;
      iVar18 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + (int)uVar17;
      uVar17 = (sStack_e0 << ((byte)BStack_d8.bitsConsumed & 0x3f)) >> bVar14;
      uVar29 = (uStack_120 << ((byte)iVar18 & 0x3f)) >> bVar14;
      *puVar30 = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
      iVar22 = *(byte *)((long)DTable + uVar23 * 2 + 5) + uStack_10c;
      puVar30[uVar11] = *(undefined1 *)((long)DTable + uVar23 * 2 + 4);
      iVar24 = *(byte *)((long)DTable + uVar27 * 2 + 5) + uStack_124;
      puVar30[uVar11 * 2] = *(undefined1 *)((long)DTable + uVar27 * 2 + 4);
      iVar26 = *(byte *)((long)DTable + uVar17 * 2 + 5) + BStack_d8.bitsConsumed;
      puVar30[lVar10] = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
      uVar20 = (uVar31 << ((byte)iVar22 & 0x3f)) >> bVar14;
      uVar23 = (uStack_130 << ((byte)iVar24 & 0x3f)) >> bVar14;
      iVar18 = (uint)*(byte *)((long)DTable + uVar29 * 2 + 5) + iVar18;
      uVar27 = (sStack_e0 << ((byte)iVar26 & 0x3f)) >> bVar14;
      uVar17 = (uStack_120 << ((byte)iVar18 & 0x3f)) >> bVar14;
      puVar30[1] = *(undefined1 *)((long)DTable + uVar29 * 2 + 4);
      iVar22 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar22;
      puVar30[uVar11 + 1] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
      iVar24 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 5) + iVar24;
      puVar30[uVar11 * 2 + 1] = *(undefined1 *)((long)DTable + uVar23 * 2 + 4);
      iVar26 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 5) + iVar26;
      puVar30[lVar10 + 1] = *(undefined1 *)((long)DTable + uVar27 * 2 + 4);
      iVar18 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar18;
      puVar30[2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
      uVar20 = (uVar31 << ((byte)iVar22 & 0x3f)) >> bVar14;
      uVar23 = (uStack_130 << ((byte)iVar24 & 0x3f)) >> bVar14;
      iVar22 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar22;
      uVar27 = (sStack_e0 << ((byte)iVar26 & 0x3f)) >> bVar14;
      uVar17 = (uStack_120 << ((byte)iVar18 & 0x3f)) >> bVar14;
      puVar30[uVar11 + 2] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
      iVar24 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 5) + iVar24;
      puVar30[uVar11 * 2 + 2] = *(undefined1 *)((long)DTable + uVar23 * 2 + 4);
      iVar26 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 5) + iVar26;
      puVar30[lVar10 + 2] = *(undefined1 *)((long)DTable + uVar27 * 2 + 4);
      uVar16 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar18;
      puVar30[3] = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
      uVar20 = (uVar31 << ((byte)iVar22 & 0x3f)) >> bVar14;
      bVar4 = *(byte *)((long)DTable + uVar20 * 2 + 5);
      puVar30[uVar11 + 3] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
      uVar20 = (uStack_130 << ((byte)iVar24 & 0x3f)) >> bVar14;
      bVar5 = *(byte *)((long)DTable + uVar20 * 2 + 5);
      puVar30[uVar11 * 2 + 3] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
      uVar20 = (sStack_e0 << ((byte)iVar26 & 0x3f)) >> bVar14;
      bVar6 = *(byte *)((long)DTable + uVar20 * 2 + 5);
      puVar30[lVar10 + 3] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
      iVar18 = 3;
      if (puStack_118 < puStack_88) {
        iVar19 = 3;
      }
      else {
        puStack_118 = (ulong *)((long)puStack_118 - (ulong)(uVar16 >> 3));
        uVar16 = uVar16 & 7;
        uStack_120 = *puStack_118;
        iVar19 = 0;
      }
      uVar17 = (ulong)uVar16;
      uStack_10c = iVar22 + (uint)bVar4;
      if (puStack_90 <= puStack_108) {
        puStack_108 = (ulong *)((long)puStack_108 - (ulong)(uStack_10c >> 3));
        uStack_10c = uStack_10c & 7;
        uVar31 = *puStack_108;
        iVar18 = 0;
      }
      uStack_124 = iVar24 + (uint)bVar5;
      iVar24 = 3;
      if (puStack_100 < puStack_98) {
        iVar22 = 3;
      }
      else {
        puStack_100 = (ulong *)((long)puStack_100 - (ulong)(uStack_124 >> 3));
        uStack_124 = uStack_124 & 7;
        uStack_130 = *puStack_100;
        iVar22 = 0;
      }
      BStack_d8.bitsConsumed = iVar26 + (uint)bVar6;
      if (BStack_d8.limitPtr <= BStack_d8.ptr) {
        BStack_d8.ptr = (char *)((long)BStack_d8.ptr - (ulong)(BStack_d8.bitsConsumed >> 3));
        BStack_d8.bitsConsumed = BStack_d8.bitsConsumed & 7;
        sStack_e0 = *(size_t *)BStack_d8.ptr;
        iVar24 = 0;
      }
    } while ((puVar30 + lVar10 + 4 < puVar12) &&
            (puVar25 = puVar30 + 4, ((iVar18 == 0 && iVar19 == 0) && iVar22 == 0) && iVar24 == 0));
    puVar30 = puVar30 + 4;
    puVar21 = puVar30 + uVar11 * 2;
    puVar25 = puVar30 + uVar11;
    puStack_f8 = puVar30 + lVar10;
  }
  BStack_d8.bitContainer = sStack_e0;
  if ((puVar1 < puVar30) || (puVar2 < puVar25)) {
    return 0xffffffffffffffec;
  }
  if (puVar3 < puVar21) {
    return 0xffffffffffffffec;
  }
  bVar14 = -(char)uStack_78 & 0x3f;
  do {
    uVar16 = (uint)uVar17;
    if (uVar16 < 0x41) {
      if (puStack_118 < puStack_88) {
        if (puStack_118 == puVar28) {
          bVar32 = false;
          goto LAB_0023c904;
        }
        bVar32 = puVar28 <= (ulong *)((long)puStack_118 - (uVar17 >> 3));
        uVar15 = (int)puStack_118 - (int)puVar28;
        if (bVar32) {
          uVar15 = (uint)(uVar17 >> 3);
        }
        uVar16 = uVar16 + uVar15 * -8;
      }
      else {
        uVar15 = (uint)(uVar17 >> 3);
        uVar16 = uVar16 & 7;
        bVar32 = true;
      }
      uVar17 = (ulong)uVar16;
      puStack_118 = (ulong *)((long)puStack_118 - (ulong)uVar15);
      uStack_120 = *puStack_118;
    }
    else {
      bVar32 = false;
    }
LAB_0023c904:
    uVar16 = (uint)uVar17;
    if ((puVar1 + -3 <= puVar30) || (!bVar32)) break;
    uVar11 = (uStack_120 << ((byte)uVar17 & 0x3f)) >> bVar14;
    iVar18 = *(byte *)((long)DTable + uVar11 * 2 + 5) + uVar16;
    uVar20 = (uStack_120 << ((byte)iVar18 & 0x3f)) >> bVar14;
    *puVar30 = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    iVar18 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar18;
    uVar11 = (uStack_120 << ((byte)iVar18 & 0x3f)) >> bVar14;
    puVar30[1] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
    iVar18 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 5) + iVar18;
    puVar30[2] = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    uVar11 = (uStack_120 << ((byte)iVar18 & 0x3f)) >> bVar14;
    uVar17 = (ulong)((uint)*(byte *)((long)DTable + uVar11 * 2 + 5) + iVar18);
    puVar30[3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    puVar30 = puVar30 + 4;
  } while( true );
  for (; puVar30 < puVar1; puVar30 = puVar30 + 1) {
    uVar11 = (uStack_120 << ((byte)uVar17 & 0x3f)) >> bVar14;
    uVar16 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 5) + (int)uVar17;
    *puVar30 = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    uVar17 = (ulong)uVar16;
  }
  do {
    if (uStack_10c < 0x41) {
      if (puStack_108 < puStack_90) {
        if (puStack_108 == puStack_68) goto LAB_0023c9ee;
        bVar32 = puStack_68 <= (ulong *)((long)puStack_108 - (ulong)(uStack_10c >> 3));
        uVar15 = (int)puStack_108 - (int)puStack_68;
        if (bVar32) {
          uVar15 = uStack_10c >> 3;
        }
        uStack_10c = uStack_10c + uVar15 * -8;
      }
      else {
        uVar15 = uStack_10c >> 3;
        uStack_10c = uStack_10c & 7;
        bVar32 = true;
      }
      puStack_108 = (ulong *)((long)puStack_108 - (ulong)uVar15);
      uVar31 = *puStack_108;
    }
    else {
LAB_0023c9ee:
      bVar32 = false;
    }
    if ((puVar2 + -3 <= puVar25) || (!bVar32)) break;
    uVar11 = (uVar31 << ((byte)uStack_10c & 0x3f)) >> bVar14;
    iVar18 = *(byte *)((long)DTable + uVar11 * 2 + 5) + uStack_10c;
    uVar20 = (uVar31 << ((byte)iVar18 & 0x3f)) >> bVar14;
    *puVar25 = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    iVar18 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar18;
    uVar11 = (uVar31 << ((byte)iVar18 & 0x3f)) >> bVar14;
    puVar25[1] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
    iVar18 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 5) + iVar18;
    puVar25[2] = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    uVar11 = (uVar31 << ((byte)iVar18 & 0x3f)) >> bVar14;
    uStack_10c = (uint)*(byte *)((long)DTable + uVar11 * 2 + 5) + iVar18;
    puVar25[3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    puVar25 = puVar25 + 4;
  } while( true );
  for (; puVar25 < puVar2; puVar25 = puVar25 + 1) {
    uVar11 = (uVar31 << ((byte)uStack_10c & 0x3f)) >> bVar14;
    uStack_10c = *(byte *)((long)DTable + uVar11 * 2 + 5) + uStack_10c;
    *puVar25 = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
  }
  do {
    if (uStack_124 < 0x41) {
      if (puStack_100 < puStack_98) {
        if (puStack_100 == puStack_70) goto LAB_0023cb38;
        bVar32 = puStack_70 <= (ulong *)((long)puStack_100 - (ulong)(uStack_124 >> 3));
        uVar15 = (int)puStack_100 - (int)puStack_70;
        if (bVar32) {
          uVar15 = uStack_124 >> 3;
        }
        uStack_124 = uStack_124 + uVar15 * -8;
      }
      else {
        uVar15 = uStack_124 >> 3;
        uStack_124 = uStack_124 & 7;
        bVar32 = true;
      }
      puStack_100 = (ulong *)((long)puStack_100 - (ulong)uVar15);
      uStack_130 = *puStack_100;
    }
    else {
LAB_0023cb38:
      bVar32 = false;
    }
    if ((puVar3 + -3 <= puVar21) || (!bVar32)) break;
    uVar11 = (uStack_130 << ((byte)uStack_124 & 0x3f)) >> bVar14;
    iVar18 = *(byte *)((long)DTable + uVar11 * 2 + 5) + uStack_124;
    uVar20 = (uStack_130 << ((byte)iVar18 & 0x3f)) >> bVar14;
    *puVar21 = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    iVar18 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar18;
    uVar11 = (uStack_130 << ((byte)iVar18 & 0x3f)) >> bVar14;
    puVar21[1] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
    iVar18 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 5) + iVar18;
    puVar21[2] = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    uVar11 = (uStack_130 << ((byte)iVar18 & 0x3f)) >> bVar14;
    uStack_124 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 5) + iVar18;
    puVar21[3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    puVar21 = puVar21 + 4;
  } while( true );
  for (; puVar21 < puVar3; puVar21 = puVar21 + 1) {
    uVar11 = (uStack_130 << ((byte)uStack_124 & 0x3f)) >> bVar14;
    uStack_124 = *(byte *)((long)DTable + uVar11 * 2 + 5) + uStack_124;
    *puVar21 = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
  }
  do {
    if (BStack_d8.bitsConsumed < 0x41) {
      if (BStack_d8.ptr < BStack_d8.limitPtr) {
        if (BStack_d8.ptr == BStack_d8.start) goto LAB_0023cc7b;
        bVar32 = BStack_d8.start <=
                 (size_t *)((long)BStack_d8.ptr - (ulong)(BStack_d8.bitsConsumed >> 3));
        uVar15 = (int)BStack_d8.ptr - (int)BStack_d8.start;
        if (bVar32) {
          uVar15 = BStack_d8.bitsConsumed >> 3;
        }
        BStack_d8.ptr = (char *)((long)BStack_d8.ptr - (ulong)uVar15);
        BStack_d8.bitsConsumed = BStack_d8.bitsConsumed + uVar15 * -8;
        BStack_d8.bitContainer = *(size_t *)BStack_d8.ptr;
      }
      else {
        BStack_d8.ptr = (char *)((long)BStack_d8.ptr - (ulong)(BStack_d8.bitsConsumed >> 3));
        BStack_d8.bitsConsumed = BStack_d8.bitsConsumed & 7;
        BStack_d8.bitContainer = *(size_t *)BStack_d8.ptr;
        bVar32 = true;
      }
    }
    else {
LAB_0023cc7b:
      bVar32 = false;
    }
    if ((puVar12 <= puStack_f8) || (!bVar32)) {
      for (; puStack_f8 < puStack_a8 + sStack_a0; puStack_f8 = puStack_f8 + 1) {
        uVar11 = (BStack_d8.bitContainer << ((byte)BStack_d8.bitsConsumed & 0x3f)) >> bVar14;
        BStack_d8.bitsConsumed = *(byte *)((long)DTable + uVar11 * 2 + 5) + BStack_d8.bitsConsumed;
        *puStack_f8 = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
      }
      if (BStack_d8.bitsConsumed != 0x40) {
        sStack_a0 = 0xffffffffffffffec;
      }
      if (BStack_d8.ptr != BStack_d8.start) {
        sStack_a0 = 0xffffffffffffffec;
      }
      if (uStack_124 != 0x40) {
        sStack_a0 = 0xffffffffffffffec;
      }
      if (puStack_100 != puStack_70) {
        sStack_a0 = 0xffffffffffffffec;
      }
      if (uStack_10c != 0x40) {
        sStack_a0 = 0xffffffffffffffec;
      }
      if (puStack_108 != puStack_68) {
        sStack_a0 = 0xffffffffffffffec;
      }
      if (uVar16 != 0x40) {
        sStack_a0 = 0xffffffffffffffec;
      }
      if (puStack_118 != puVar28) {
        return 0xffffffffffffffec;
      }
      return sStack_a0;
    }
    uVar11 = (BStack_d8.bitContainer << ((byte)BStack_d8.bitsConsumed & 0x3f)) >> bVar14;
    iVar18 = *(byte *)((long)DTable + uVar11 * 2 + 5) + BStack_d8.bitsConsumed;
    uVar23 = (BStack_d8.bitContainer << ((byte)iVar18 & 0x3f)) >> bVar14;
    *puStack_f8 = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    iVar18 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 5) + iVar18;
    uVar20 = (BStack_d8.bitContainer << ((byte)iVar18 & 0x3f)) >> bVar14;
    puStack_f8[1] = *(undefined1 *)((long)DTable + uVar23 * 2 + 4);
    iVar18 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar18;
    uVar11 = (BStack_d8.bitContainer << ((byte)iVar18 & 0x3f)) >> bVar14;
    puStack_f8[2] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
    BStack_d8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar11 * 2 + 5) + iVar18;
    puStack_f8[3] = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    puStack_f8 = puStack_f8 + 4;
  } while( true );
}

Assistant:

size_t HUF_decompress4X_usingDTable_bmi2(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int bmi2)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#endif
}